

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestRptrNumEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int_int *fun,uint testSize)

{
  int iVar1;
  int iVar2;
  uint local_40;
  uint local_3c;
  uint base;
  uint index;
  uchar *start;
  uint testSize_local;
  _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int_int *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_3c = 0; local_3c < 9; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 10; local_40 = local_40 + 1) {
      if ((testSize & 1) != 0) {
        if ((testIndexRegs[local_3c] != rNONE) || (testBaseRegs[local_40] != rNONE)) {
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0,8);
          iVar1 = (*fun)(puStack_18,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0,8);
          puStack_18 = puStack_18 + iVar1;
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],4,8);
          iVar1 = (*fun)(puStack_18,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],4,8);
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0x400,8);
          iVar2 = (*fun)(puStack_18 + iVar1,sDWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],
                         0x400,8);
          puStack_18 = puStack_18 + iVar1 + iVar2;
        }
        if (testIndexRegs[local_3c] != rNONE) {
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0,8);
          iVar1 = (*fun)(puStack_18,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0,8);
          puStack_18 = puStack_18 + iVar1;
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],4,8);
          iVar1 = (*fun)(puStack_18,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],4,8);
          EMIT_OP_RPTR_NUM(ctx,op,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0x400,8);
          iVar2 = (*fun)(puStack_18 + iVar1,sDWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],
                         0x400,8);
          puStack_18 = puStack_18 + iVar1 + iVar2;
        }
      }
      if ((testSize & 2) != 0) {
        if ((testIndexRegs[local_3c] != rNONE) || (testBaseRegs[local_40] != rNONE)) {
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0,8);
          iVar1 = (*fun)(puStack_18,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0,8);
          puStack_18 = puStack_18 + iVar1;
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],4,8);
          iVar1 = (*fun)(puStack_18,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],4,8);
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],0x400,8);
          iVar2 = (*fun)(puStack_18 + iVar1,sQWORD,testIndexRegs[local_3c],1,testBaseRegs[local_40],
                         0x400,8);
          puStack_18 = puStack_18 + iVar1 + iVar2;
        }
        if (testIndexRegs[local_3c] != rNONE) {
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0,8);
          iVar1 = (*fun)(puStack_18,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0,8);
          puStack_18 = puStack_18 + iVar1;
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],4,8);
          iVar1 = (*fun)(puStack_18,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],4,8);
          EMIT_OP_RPTR_NUM(ctx,op,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],0x400,8);
          iVar2 = (*fun)(puStack_18 + iVar1,sQWORD,testIndexRegs[local_3c],2,testBaseRegs[local_40],
                         0x400,8);
          puStack_18 = puStack_18 + iVar1 + iVar2;
        }
      }
    }
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestRptrNumEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
	{
		for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
		{
			if(testSize & testSizeDword)
			{
				if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
				{
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, 8);
				}

				if(testIndexRegs[index] != rNONE)
				{
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, 8);
					stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, 8);
				}
			}

			if(testSize & testSizeQword)
			{
				// skip RDI-based addressing
				if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
				{
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, 8);
				}

				if(testIndexRegs[index] != rNONE)
				{
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, 8);
					EMIT_OP_RPTR_NUM(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, 8);
					stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, 8);
				}
			}
		}
	}

	return int(stream - start);
}